

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyramid.c
# Opt level: O0

ImagePyramid * aom_alloc_pyramid(int width,int height,_Bool image_is_16bit)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  long lVar6;
  void *pvVar7;
  byte in_DL;
  uint in_ESI;
  uint in_EDI;
  PyramidLayer *layer_1;
  int level_1;
  size_t level_start;
  size_t level_alloc_start;
  int level_stride;
  int padded_height;
  int padded_width;
  int level_height;
  int level_width;
  PyramidLayer *layer;
  int level;
  int first_allocated_level;
  size_t extra_bytes;
  size_t first_px_offset;
  size_t *layer_offsets;
  size_t buffer_size;
  ImagePyramid *pyr;
  int n_levels;
  int msb;
  int local_98;
  uint local_94;
  long *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  size_t in_stack_ffffffffffffff80;
  size_t in_stack_ffffffffffffff88;
  uint local_50;
  size_t local_30;
  pthread_mutex_t *local_8;
  
  local_94 = in_ESI;
  if ((int)in_EDI < (int)in_ESI) {
    local_94 = in_EDI;
  }
  local_98 = get_msb(local_94);
  if (local_98 + -3 < 2) {
    local_98 = 1;
  }
  else {
    local_98 = local_98 + -3;
  }
  local_8 = (pthread_mutex_t *)
            aom_calloc(CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       (size_t)in_stack_ffffffffffffff70);
  if (local_8 == (pthread_mutex_t *)0x0) {
    local_8 = (pthread_mutex_t *)0x0;
  }
  else {
    pvVar5 = aom_calloc(CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                        (size_t)in_stack_ffffffffffffff70);
    *(void **)((long)local_8 + 0x38) = pvVar5;
    if (*(long *)((long)local_8 + 0x38) == 0) {
      aom_free(in_stack_ffffffffffffff70);
      local_8 = (pthread_mutex_t *)0x0;
    }
    else {
      local_8[1].__data.__lock = local_98;
      *(undefined4 *)((long)local_8 + 0x2c) = 0;
      pvVar5 = aom_calloc(CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                          (size_t)in_stack_ffffffffffffff70);
      if (pvVar5 == (void *)0x0) {
        aom_free(in_stack_ffffffffffffff70);
        aom_free(in_stack_ffffffffffffff70);
        local_8 = (pthread_mutex_t *)0x0;
      }
      else {
        uVar4 = (uint)((in_DL & 1) == 0);
        local_30 = 0x10;
        for (local_50 = uVar4; (int)local_50 < local_98; local_50 = local_50 + 1) {
          lVar6 = *(long *)((long)local_8 + 0x38) + (long)(int)local_50 * 0x18;
          iVar1 = (int)in_EDI >> ((byte)local_50 & 0x1f);
          iVar2 = (int)in_ESI >> ((byte)local_50 & 0x1f);
          uVar3 = iVar1 + 0x3fU & 0xffffffe0;
          in_stack_ffffffffffffff80 = local_30 + (long)(int)(uVar3 << 4) + 0x10;
          *(size_t *)((long)pvVar5 + (long)(int)local_50 * 8) = in_stack_ffffffffffffff80;
          *(int *)(lVar6 + 8) = iVar1;
          *(int *)(lVar6 + 0xc) = iVar2;
          *(uint *)(lVar6 + 0x10) = uVar3;
          in_stack_ffffffffffffff88 = local_30;
          local_30 = (long)(int)(uVar3 * (iVar2 + 0x20)) + local_30;
        }
        pvVar7 = aom_memalign(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
        *(void **)((long)local_8 + 0x30) = pvVar7;
        if (*(long *)((long)local_8 + 0x30) == 0) {
          aom_free(in_stack_ffffffffffffff70);
          aom_free(in_stack_ffffffffffffff70);
          aom_free(in_stack_ffffffffffffff70);
          local_8 = (pthread_mutex_t *)0x0;
        }
        else {
          for (; (int)uVar4 < local_98; uVar4 = uVar4 + 1) {
            in_stack_ffffffffffffff70 =
                 (long *)(*(long *)((long)local_8 + 0x38) + (long)(int)uVar4 * 0x18);
            *in_stack_ffffffffffffff70 =
                 *(long *)((long)local_8 + 0x30) + *(long *)((long)pvVar5 + (long)(int)uVar4 * 8);
          }
          pthread_mutex_init(local_8,(pthread_mutexattr_t *)0x0);
          aom_free(in_stack_ffffffffffffff70);
        }
      }
    }
  }
  return (ImagePyramid *)local_8;
}

Assistant:

ImagePyramid *aom_alloc_pyramid(int width, int height, bool image_is_16bit) {
  // Allocate the maximum possible number of layers for this width and height
  const int msb = get_msb(AOMMIN(width, height));
  const int n_levels = AOMMAX(msb - MIN_PYRAMID_SIZE_LOG2, 1);

  ImagePyramid *pyr = aom_calloc(1, sizeof(*pyr));
  if (!pyr) {
    return NULL;
  }

  pyr->layers = aom_calloc(n_levels, sizeof(*pyr->layers));
  if (!pyr->layers) {
    aom_free(pyr);
    return NULL;
  }

  pyr->max_levels = n_levels;
  pyr->filled_levels = 0;

  // Compute sizes and offsets for each pyramid level
  // These are gathered up first, so that we can allocate all pyramid levels
  // in a single buffer
  size_t buffer_size = 0;
  size_t *layer_offsets = aom_calloc(n_levels, sizeof(*layer_offsets));
  if (!layer_offsets) {
    aom_free(pyr->layers);
    aom_free(pyr);
    return NULL;
  }

  // Work out if we need to allocate a few extra bytes for alignment.
  // aom_memalign() will ensure that the start of the allocation is aligned
  // to a multiple of PYRAMID_ALIGNMENT. But we want the first image pixel
  // to be aligned, not the first byte of the allocation.
  //
  // In the loop below, we ensure that the stride of every image is a multiple
  // of PYRAMID_ALIGNMENT. Thus the allocated size of each pyramid level will
  // also be a multiple of PYRAMID_ALIGNMENT. Thus, as long as we can get the
  // first pixel in the first pyramid layer aligned properly, that will
  // automatically mean that the first pixel of every row of every layer is
  // properly aligned too.
  //
  // Thus all we need to consider is the first pixel in the first layer.
  // This is located at offset
  //   extra_bytes + level_stride * PYRAMID_PADDING + PYRAMID_PADDING
  // bytes into the buffer. Since level_stride is a multiple of
  // PYRAMID_ALIGNMENT, we can ignore that. So we need
  //   extra_bytes + PYRAMID_PADDING = multiple of PYRAMID_ALIGNMENT
  //
  // To solve this, we can round PYRAMID_PADDING up to the next multiple
  // of PYRAMID_ALIGNMENT, then subtract the orginal value to calculate
  // how many extra bytes are needed.
  size_t first_px_offset =
      (PYRAMID_PADDING + PYRAMID_ALIGNMENT - 1) & ~(PYRAMID_ALIGNMENT - 1);
  size_t extra_bytes = first_px_offset - PYRAMID_PADDING;
  buffer_size += extra_bytes;

  // If the original image is stored in an 8-bit buffer, then we can point the
  // lowest pyramid level at that buffer rather than allocating a new one.
  int first_allocated_level = image_is_16bit ? 0 : 1;

  for (int level = first_allocated_level; level < n_levels; level++) {
    PyramidLayer *layer = &pyr->layers[level];

    int level_width = width >> level;
    int level_height = height >> level;

    // Allocate padding for each layer
    int padded_width = level_width + 2 * PYRAMID_PADDING;
    int padded_height = level_height + 2 * PYRAMID_PADDING;

    // Align the layer stride to be a multiple of PYRAMID_ALIGNMENT
    // This ensures that, as long as the top-left pixel in this pyramid level is
    // properly aligned, then so will the leftmost pixel in every row of the
    // pyramid level.
    int level_stride =
        (padded_width + PYRAMID_ALIGNMENT - 1) & ~(PYRAMID_ALIGNMENT - 1);

    size_t level_alloc_start = buffer_size;
    size_t level_start =
        level_alloc_start + PYRAMID_PADDING * level_stride + PYRAMID_PADDING;

    buffer_size += level_stride * padded_height;

    layer_offsets[level] = level_start;
    layer->width = level_width;
    layer->height = level_height;
    layer->stride = level_stride;
  }

  pyr->buffer_alloc =
      aom_memalign(PYRAMID_ALIGNMENT, buffer_size * sizeof(*pyr->buffer_alloc));
  if (!pyr->buffer_alloc) {
    aom_free(pyr->layers);
    aom_free(pyr);
    aom_free(layer_offsets);
    return NULL;
  }

  // Fill in pointers for each level
  // If image is 8-bit, then the lowest level is left unconfigured for now,
  // and will be set up properly when the pyramid is filled in
  for (int level = first_allocated_level; level < n_levels; level++) {
    PyramidLayer *layer = &pyr->layers[level];
    layer->buffer = pyr->buffer_alloc + layer_offsets[level];
  }

#if CONFIG_MULTITHREAD
  pthread_mutex_init(&pyr->mutex, NULL);
#endif  // CONFIG_MULTITHREAD

  aom_free(layer_offsets);
  return pyr;
}